

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::Path::LessThan(Path *lhs,Path *rhs)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  string *__rhs;
  ulong uVar7;
  unsigned_long *puVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var15;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last2;
  bool local_141;
  size_type local_108;
  size_t parent_idx;
  size_t child_idx;
  size_t i;
  size_type sStack_e8;
  bool same_until_common_depth;
  size_type local_e0;
  ulong local_d8;
  size_t didx;
  string local_c8;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_prim_names;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_prim_names;
  string *rhs_prop_part;
  string *lhs_prop_part;
  Path *rhs_local;
  Path *lhs_local;
  
  bVar1 = is_valid(lhs);
  if ((bVar1) && (bVar1 = is_valid(rhs), bVar1)) {
    bVar1 = is_absolute_path(lhs);
    if ((bVar1) && (bVar1 = is_absolute_path(rhs), bVar1)) {
      psVar6 = prim_part_abi_cxx11_(lhs);
      __rhs = prim_part_abi_cxx11_(rhs);
      _Var2 = std::operator==(psVar6,__rhs);
      if (_Var2) {
        prop_part_abi_cxx11_(lhs);
        prop_part_abi_cxx11_(rhs);
        uVar7 = std::__cxx11::string::empty();
        if (((uVar7 & 1) == 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
          _Var13._M_current = (char *)std::__cxx11::string::begin();
          _Var14._M_current = (char *)std::__cxx11::string::end();
          _Var15._M_current = (char *)std::__cxx11::string::begin();
          lhs_prim_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::end();
          lhs_local._7_1_ =
               lexicographical_compare<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (_Var13,_Var14,_Var15,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )lhs_prim_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          bVar3 = std::__cxx11::string::empty();
          lhs_local._7_1_ = (bool)(bVar3 & 1);
        }
      }
      else {
        psVar6 = prim_part_abi_cxx11_(lhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_88,"/",
                   (allocator *)
                   ((long)&rhs_prim_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        iVar5 = std::numeric_limits<int>::max();
        split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68,psVar6,&local_88,iVar5 / 100);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&rhs_prim_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        psVar6 = prim_part_abi_cxx11_(rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,"/",(allocator *)((long)&didx + 7));
        iVar5 = std::numeric_limits<int>::max();
        split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,psVar6,&local_c8,iVar5 / 100);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&didx + 7));
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68);
        if ((bVar1) ||
           (bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_a8), bVar1)) {
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68);
          local_141 = false;
          if (bVar1) {
            sVar11 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_a8);
            local_141 = sVar11 != 0;
          }
          lhs_local._7_1_ = local_141;
        }
        else {
          local_e0 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68);
          sStack_e8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_a8);
          puVar8 = std::min<unsigned_long>(&local_e0,&stack0xffffffffffffff18);
          local_d8 = *puVar8;
          bVar1 = true;
          for (child_idx = 0; child_idx < local_d8; child_idx = child_idx + 1) {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,child_idx);
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_a8,child_idx);
            bVar4 = std::operator!=(pvVar9,pvVar10);
            if (bVar4) {
              bVar1 = false;
              break;
            }
          }
          if (bVar1) {
            sVar11 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68);
            sVar12 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_a8);
            lhs_local._7_1_ = sVar11 < sVar12;
          }
          else {
            parent_idx = local_d8 - 1;
            if (1 < local_d8) {
              for (local_108 = local_d8 - 2; local_108 != 0; local_108 = local_108 - 1) {
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_68,local_108);
                pvVar10 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_a8,local_108);
                bVar1 = std::operator!=(pvVar9,pvVar10);
                if (bVar1) {
                  parent_idx = parent_idx - 1;
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68,parent_idx);
            _Var13._M_current = (char *)std::__cxx11::string::begin();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68,parent_idx);
            _Var14._M_current = (char *)std::__cxx11::string::end();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8,parent_idx);
            _Var15._M_current = (char *)std::__cxx11::string::begin();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8,parent_idx);
            last2._M_current = (char *)std::__cxx11::string::end();
            lhs_local._7_1_ =
                 lexicographical_compare<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                           (_Var13,_Var14,_Var15,last2);
          }
        }
        didx._0_4_ = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
      }
    }
    else {
      lhs_local._7_1_ = is_absolute_path(lhs);
    }
  }
  else {
    lhs_local._7_1_ = is_valid(lhs);
  }
  return lhs_local._7_1_;
}

Assistant:

bool Path::LessThan(const Path &lhs, const Path &rhs) {
  // DCOUT("LessThan");
  if (lhs.is_valid() && rhs.is_valid()) {
    // ok
  } else {
    // Even though this should not happen,
    // valid paths is less than invalid paths
    return lhs.is_valid();
  }

  // TODO: handle relative path correctly.
  if (lhs.is_absolute_path() && rhs.is_absolute_path()) {
    // ok
  } else {
    // Absolute paths are less than relative paths
    return lhs.is_absolute_path();
  }

  if (lhs.prim_part() == rhs.prim_part()) {
    // compare property
    const std::string &lhs_prop_part = lhs.prop_part();
    const std::string &rhs_prop_part = rhs.prop_part();

    if (lhs_prop_part.empty() || rhs_prop_part.empty()) {
      return lhs_prop_part.empty();
    }

    return ::tinyusdz::lexicographical_compare(
        lhs_prop_part.begin(), lhs_prop_part.end(), rhs_prop_part.begin(),
        rhs_prop_part.end());

  } else {
    const std::vector<std::string> lhs_prim_names = split(lhs.prim_part(), "/");
    const std::vector<std::string> rhs_prim_names = split(rhs.prim_part(), "/");
    // DCOUT("lhs_names = " << to_string(lhs_prim_names));
    // DCOUT("rhs_names = " << to_string(rhs_prim_names));

    if (lhs_prim_names.empty() || rhs_prim_names.empty()) {
      return lhs_prim_names.empty() && rhs_prim_names.size();
    }

    // common shortest depth.
    size_t didx = (std::min)(lhs_prim_names.size(), rhs_prim_names.size());

    bool same_until_common_depth = true;
    for (size_t i = 0; i < didx; i++) {
      if (lhs_prim_names[i] != rhs_prim_names[i]) {
        same_until_common_depth = false;
        break;
      }
    }

    if (same_until_common_depth) {
      // tail differs. compare by depth count.
      return lhs_prim_names.size() < rhs_prim_names.size();
    }

    // Walk until common ancestor is found
    size_t child_idx = didx - 1;
    // DCOUT("common_depth_idx = " << didx << ", lcount = " <<
    // lhs_prim_names.size() << ", rcount = " << rhs_prim_names.size());
    if (didx > 1) {
      for (size_t parent_idx = didx - 2; parent_idx > 0; parent_idx--) {
        // DCOUT("parent_idx = " << parent_idx);
        if (lhs_prim_names[parent_idx] != rhs_prim_names[parent_idx]) {
          child_idx--;
        }
      }
    }
    // DCOUT("child_idx = " << child_idx);

    // compare child node
    return ::tinyusdz::lexicographical_compare(
        lhs_prim_names[child_idx].begin(), lhs_prim_names[child_idx].end(),
        rhs_prim_names[child_idx].begin(), rhs_prim_names[child_idx].end());
  }
}